

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableSet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableSet *curr)

{
  bool bVar1;
  uint uVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  Literal *pLVar4;
  undefined1 local_d8 [8];
  TableInterfaceInfo info;
  Flow valueFlow;
  undefined1 local_68 [8];
  Flow indexFlow;
  TableSet *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  indexFlow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar3,
             *(Expression **)(indexFlow.breakTo.super_IString.str._M_str + 0x20));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&info.name.super_IString.str._M_str,pEVar3,
               *(Expression **)(indexFlow.breakTo.super_IString.str._M_str + 0x28));
    bVar1 = Flow::breaking((Flow *)&info.name.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&info.name.super_IString.str._M_str);
    }
    else {
      getTableInterfaceInfo
                ((TableInterfaceInfo *)local_d8,this,
                 (Name)((IString *)(indexFlow.breakTo.super_IString.str._M_str + 0x10))->str);
      pLVar4 = Flow::getSingleValue((Flow *)local_68);
      uVar2 = wasm::Literal::geti32(pLVar4);
      pLVar4 = Flow::getSingleValue((Flow *)&info.name.super_IString.str._M_str);
      (*(*(_func_int ***)local_d8)[0x1c])
                (local_d8,info.interface,info.name.super_IString.str._M_len,(ulong)uVar2,pLVar4);
      Flow::Flow(__return_storage_ptr__);
    }
    Flow::~Flow((Flow *)&info.name.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableSet(TableSet* curr) {
    NOTE_ENTER("TableSet");
    Flow indexFlow = self()->visit(curr->index);
    if (indexFlow.breaking()) {
      return indexFlow;
    }
    Flow valueFlow = self()->visit(curr->value);
    if (valueFlow.breaking()) {
      return valueFlow;
    }
    auto info = getTableInterfaceInfo(curr->table);
    info.interface->tableStore(info.name,
                               indexFlow.getSingleValue().geti32(),
                               valueFlow.getSingleValue());
    return Flow();
  }